

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderRendering.cpp
# Opt level: O0

uint __thiscall
glcts::GeometryShaderRenderingTrianglesCase::getAmountOfVerticesPerInstance
          (GeometryShaderRenderingTrianglesCase *this)

{
  TestError *this_00;
  uint local_14;
  uint result;
  GeometryShaderRenderingTrianglesCase *this_local;
  
  switch(this->m_drawcall_mode) {
  case 4:
    local_14 = 0xc;
    break;
  case 5:
    local_14 = 7;
    break;
  case 6:
    local_14 = 6;
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Unrecognized draw call mode",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
               ,0x1090);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  case 0xc:
    local_14 = 0x18;
    break;
  case 0xd:
    local_14 = 0xe;
  }
  return local_14;
}

Assistant:

unsigned int GeometryShaderRenderingTrianglesCase::getAmountOfVerticesPerInstance()
{
	unsigned int result = 0;

	switch (m_drawcall_mode)
	{
	case GL_TRIANGLES:
	{
		result = 3 /* vertices making up a single triangle */ * 4 /* triangles */;

		break;
	}

	case GL_TRIANGLES_ADJACENCY_EXT:
	{
		result = 3 /* vertices making up a single triangle */ * 4 /* triangles */ * 2 /* adjacency data */;

		break;
	}

	case GL_TRIANGLE_FAN:
	{
		result = 6 /* vertices in total */;

		break;
	}

	case GL_TRIANGLE_STRIP:
	{
		result = 7 /* vertices in total */;

		break;
	}

	case GL_TRIANGLE_STRIP_ADJACENCY_EXT:
	{
		/* As per extension specification */
		result = (5 /* triangles */ + 2) * 2;

		break;
	}

	default:
	{
		TCU_FAIL("Unrecognized draw call mode");
	}
	} /* switch (m_drawcall_mode) */

	return result;
}